

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint *puVar4;
  
  uVar3 = insn >> 0x16 & 3;
  uVar1 = MCInst_getOpcode(Inst);
  puVar4 = GPR64DecoderTable;
  DVar2 = MCDisassembler_Fail;
  if (0x120 < (int)uVar1) {
    if (0x486 < (int)uVar1) {
      if ((int)uVar1 < 0x7a1) {
        if (uVar1 == 0x487) goto switchD_00165af8_caseD_69;
        if (uVar1 == 0x48a) goto switchD_00165af8_caseD_6b;
        if (uVar1 != 0x79d) {
          return MCDisassembler_Fail;
        }
      }
      else {
        if ((uVar1 == 0x7a1) || (uVar1 == 0x7aa)) goto LAB_00165b64;
        if (uVar1 != 0x7a6) {
          return MCDisassembler_Fail;
        }
      }
      goto LAB_00165b16;
    }
    switch(uVar1) {
    case 0x121:
    case 0x126:
      goto switchD_00165af8_caseD_69;
    case 0x122:
    case 0x124:
    case 0x125:
    case 0x127:
    case 0x128:
      goto switchD_00165af8_caseD_6a;
    case 0x123:
    case 0x129:
      break;
    default:
      if (uVar1 == 0x480) goto switchD_00165af8_caseD_69;
      if (uVar1 != 0x482) {
        return MCDisassembler_Fail;
      }
    }
    goto switchD_00165af8_caseD_6b;
  }
  if ((int)uVar1 < 0x42) {
    if (uVar1 != 0x30) {
      if (uVar1 == 0x34) goto LAB_00165b64;
      if (uVar1 != 0x3e) {
        return MCDisassembler_Fail;
      }
    }
LAB_00165b16:
    if ((short)insn < 0 || uVar3 == 3) {
      return MCDisassembler_Fail;
    }
LAB_00165b56:
    puVar4 = GPR32DecoderTable;
  }
  else {
    switch(uVar1) {
    case 0x57:
    case 0x5d:
switchD_00165af8_caseD_69:
      if ((short)insn < 0) {
        return MCDisassembler_Fail;
      }
      goto LAB_00165b56;
    case 0x58:
    case 0x59:
    case 0x5b:
    case 0x5c:
    case 0x5e:
    case 0x5f:
      goto switchD_00165af8_caseD_6a;
    case 0x5a:
    case 0x60:
      break;
    default:
      switch(uVar1) {
      case 0x69:
      case 0x6d:
        goto switchD_00165af8_caseD_69;
      case 0x6a:
      case 0x6c:
      case 0x6e:
        goto switchD_00165af8_caseD_6a;
      case 0x6b:
      case 0x6f:
        break;
      default:
        if (uVar1 != 0x42) {
          return MCDisassembler_Fail;
        }
LAB_00165b64:
        if (uVar3 == 3) {
          return MCDisassembler_Fail;
        }
      }
    }
  }
switchD_00165af8_caseD_6b:
  MCOperand_CreateReg0(Inst,puVar4[insn & 0x1f]);
  MCOperand_CreateReg0(Inst,puVar4[insn >> 5 & 0x1f]);
  MCOperand_CreateReg0(Inst,puVar4[insn >> 0x10 & 0x1f]);
  MCOperand_CreateImm0(Inst,(ulong)(uVar3 << 6 | insn >> 10 & 0x3f));
  DVar2 = MCDisassembler_Success;
switchD_00165af8_caseD_6a:
  return DVar2;
}

Assistant:

static DecodeStatus DecodeThreeAddrSRegInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Rm = fieldFromInstruction(insn, 16, 5);
	unsigned shiftHi = fieldFromInstruction(insn, 22, 2);
	unsigned shiftLo = fieldFromInstruction(insn, 10, 6);
	unsigned shift = (shiftHi << 6) | shiftLo;

	switch (MCInst_getOpcode(Inst)) {
		default:
			return Fail;
		case AArch64_ADDWrs:
		case AArch64_ADDSWrs:
		case AArch64_SUBWrs:
		case AArch64_SUBSWrs:
			// if shift == '11' then ReservedValue()
			if (shiftHi == 0x3)
				return Fail;
			// Deliberate fallthrough
		case AArch64_ANDWrs:
		case AArch64_ANDSWrs:
		case AArch64_BICWrs:
		case AArch64_BICSWrs:
		case AArch64_ORRWrs:
		case AArch64_ORNWrs:
		case AArch64_EORWrs:
		case AArch64_EONWrs: {
				// if sf == '0' and imm6<5> == '1' then ReservedValue()
				if (shiftLo >> 5 == 1)
					return Fail;
				DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rn, Addr, Decoder);
				DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
				break;
			}
		case AArch64_ADDXrs:
		case AArch64_ADDSXrs:
		case AArch64_SUBXrs:
		case AArch64_SUBSXrs:
				 // if shift == '11' then ReservedValue()
				 if (shiftHi == 0x3)
					 return Fail;
				 // Deliberate fallthrough
		case AArch64_ANDXrs:
		case AArch64_ANDSXrs:
		case AArch64_BICXrs:
		case AArch64_BICSXrs:
		case AArch64_ORRXrs:
		case AArch64_ORNXrs:
		case AArch64_EORXrs:
		case AArch64_EONXrs:
				 DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rn, Addr, Decoder);
				 DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
				 break;
	}

	MCOperand_CreateImm0(Inst, shift);
	return Success;
}